

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::PtnSkeleton::getSkeleton(UnicodeString *__return_storage_ptr__,PtnSkeleton *this)

{
  uint uVar1;
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00471e80;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  SkeletonFields::appendTo(&this->original,__return_storage_ptr__);
  icu_63::UnicodeString::operator=(__return_storage_ptr__,__return_storage_ptr__);
  if (this->addedDefaultDayPeriod != '\0') {
    uVar1 = icu_63::UnicodeString::indexOf(__return_storage_ptr__,L'a');
    if (-1 < (int)uVar1) {
      icu_63::UnicodeString::remove(__return_storage_ptr__,(char *)(ulong)uVar1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString
PtnSkeleton::getSkeleton() const {
    UnicodeString result;
    result = original.appendTo(result);
    int32_t pos;
    if (addedDefaultDayPeriod && (pos = result.indexOf(LOW_A)) >= 0) {
        // for backward compatibility: if DateTimeMatcher.set added a single 'a' that
        // was not in the provided skeleton, remove it here before returning skeleton.
        result.remove(pos, 1);
    }
    return result;
}